

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O0

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  BigInt<unsigned_int,_unsigned_long> *x_00;
  undefined1 local_a8 [8];
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> local_78;
  BigInt<unsigned_int,_unsigned_long> local_58;
  undefined1 local_38 [8];
  BigInt<unsigned_int,_unsigned_long> p;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x_local;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this_local;
  
  p._24_8_ = x;
  operator*(&local_58,&this->_p,&x->_q);
  operator*(&local_78,(BigInt<unsigned_int,_unsigned_long> *)(p._24_8_ + 8),&this->_q);
  x_00 = operator+(&local_58,&local_78);
  BigInt<unsigned_int,_unsigned_long>::BigInt((BigInt<unsigned_int,_unsigned_long> *)local_38,x_00);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_78);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_58);
  operator*((BigInt<unsigned_int,_unsigned_long> *)local_a8,&this->_q,
            (BigInt<unsigned_int,_unsigned_long> *)(p._24_8_ + 0x28));
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&this->_p,(BigInt<unsigned_int,_unsigned_long> *)local_38);
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&this->_q,(BigInt<unsigned_int,_unsigned_long> *)local_a8);
  _simplify(this);
  BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)local_a8);
  BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)local_38);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q + x._p * _q;
		const TValue q = _q * x._q;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}